

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

void __thiscall
slang::ast::Scope::handleNameConflict
          (Scope *this,Symbol *member,Symbol **existing,bool isElaborating)

{
  SymbolKind SVar1;
  SymbolKind SVar2;
  SymbolIndex SVar3;
  GenericClassDefSymbol *this_00;
  bool bVar4;
  GenerateBlockSymbol *gen2;
  SymbolKind SVar5;
  
  this_00 = (GenericClassDefSymbol *)*existing;
  SVar1 = (this_00->super_Symbol).kind;
  SVar2 = member->kind;
  SVar5 = SVar2 ^ ForwardingTypedef;
  if (SVar1 == TypeAlias && SVar5 == Unknown) {
    TypeAliasType::addForwardDecl((TypeAliasType *)this_00,(ForwardingTypedefSymbol *)member);
    return;
  }
  if (SVar1 == ClassType && SVar5 == Unknown) {
    ClassType::addForwardDecl((ClassType *)this_00,(ForwardingTypedefSymbol *)member);
    return;
  }
  if (SVar1 == GenericClassDef && SVar5 == Unknown) {
    GenericClassDefSymbol::addForwardDecl(this_00,(ForwardingTypedefSymbol *)member);
    return;
  }
  if (SVar1 == ForwardingTypedef) {
    if ((int)SVar2 < 0x25) {
      if (SVar2 == ClassType) {
        ClassType::addForwardDecl((ClassType *)member,(ForwardingTypedefSymbol *)this_00);
        goto LAB_00331c13;
      }
      if (SVar2 == TypeAlias) {
        TypeAliasType::addForwardDecl((TypeAliasType *)member,(ForwardingTypedefSymbol *)this_00);
        goto LAB_00331c13;
      }
    }
    else {
      if (SVar2 == GenericClassDef) {
        GenericClassDefSymbol::addForwardDecl
                  ((GenericClassDefSymbol *)member,(ForwardingTypedefSymbol *)this_00);
        goto LAB_00331c13;
      }
      if (SVar2 == ForwardingTypedef) {
        ForwardingTypedefSymbol::addForwardDecl
                  ((ForwardingTypedefSymbol *)this_00,(ForwardingTypedefSymbol *)member);
        return;
      }
    }
  }
  else {
    if (SVar2 == ExplicitImport && SVar1 == ExplicitImport) {
      if (isElaborating) {
        checkImportConflict(this,member,(Symbol *)this_00);
        return;
      }
      goto LAB_00331c3c;
    }
    if ((SVar2 == GenerateBlock && SVar1 == GenerateBlock) &&
       (*(int *)((this_00->paramDecls).
                 super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.firstElement +
                0x18) == *(int *)&member[1].originatingSyntax)) {
      if ((this_00->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
          firstElement[0x1c] != '\x01') {
        return;
      }
      goto LAB_00331c13;
    }
  }
  if ((((SVar1 & ~Root) == Variable) && ((SVar2 & ~Root) == Variable)) && (SVar2 != SVar1)) {
    SVar3 = (this_00->super_Symbol).indexInScope;
    if (member->indexInScope < SVar3) {
      SVar3 = member->indexInScope;
    }
    if (SVar1 == FormalArgument) {
      bVar4 = FormalArgumentSymbol::mergeVariable
                        ((FormalArgumentSymbol *)this_00,(VariableSymbol *)member);
      if (bVar4) {
        (*existing)->indexInScope = SVar3;
        return;
      }
    }
    else {
      bVar4 = FormalArgumentSymbol::mergeVariable
                        ((FormalArgumentSymbol *)member,(VariableSymbol *)this_00);
      if (bVar4) {
        (*existing)->indexInScope = SVar3;
LAB_00331c13:
        *existing = member;
        return;
      }
    }
  }
  if (((isElaborating) || (bVar4 = Symbol::isValue(*existing), !bVar4)) ||
     (bVar4 = Symbol::isValue(member), !bVar4)) {
    reportNameConflict(this,member,*existing);
    return;
  }
LAB_00331c3c:
  Compilation::noteNameConflict(this->compilation,member);
  return;
}

Assistant:

void Scope::handleNameConflict(const Symbol& member, const Symbol*& existing,
                               bool isElaborating) const {
    // We have a name collision; first check if this is ok (forwarding typedefs share a
    // name with the actual typedef) and if not give the user a helpful error message.
    if (existing->kind == SymbolKind::TypeAlias && member.kind == SymbolKind::ForwardingTypedef) {
        // Just add this forwarding typedef to a deferred list so we can process them
        // once we know the kind of symbol the alias points to.
        existing->as<TypeAliasType>().addForwardDecl(member.as<ForwardingTypedefSymbol>());
        return;
    }

    if (existing->kind == SymbolKind::ClassType && member.kind == SymbolKind::ForwardingTypedef) {
        // Class is already defined so nothing to do. When we elaborate the scope we will
        // check that the typedef had the correct 'class' specifier.
        existing->as<ClassType>().addForwardDecl(member.as<ForwardingTypedefSymbol>());
        return;
    }

    if (existing->kind == SymbolKind::GenericClassDef &&
        member.kind == SymbolKind::ForwardingTypedef) {
        // Class is already defined so nothing to do. When we elaborate the scope we will
        // check that the typedef had the correct 'class' specifier.
        existing->as<GenericClassDefSymbol>().addForwardDecl(member.as<ForwardingTypedefSymbol>());
        return;
    }

    if (existing->kind == SymbolKind::ForwardingTypedef) {
        if (member.kind == SymbolKind::ForwardingTypedef) {
            // Found another forwarding typedef; link it to the previous one.
            existing->as<ForwardingTypedefSymbol>().addForwardDecl(
                member.as<ForwardingTypedefSymbol>());
            return;
        }

        if (member.kind == SymbolKind::TypeAlias) {
            // We found the actual type for a previous forwarding declaration. Replace it in
            // the name map.
            member.as<TypeAliasType>().addForwardDecl(existing->as<ForwardingTypedefSymbol>());
            existing = &member;
            return;
        }

        if (member.kind == SymbolKind::ClassType) {
            member.as<ClassType>().addForwardDecl(existing->as<ForwardingTypedefSymbol>());
            existing = &member;
            return;
        }

        if (member.kind == SymbolKind::GenericClassDef) {
            member.as<GenericClassDefSymbol>().addForwardDecl(
                existing->as<ForwardingTypedefSymbol>());
            existing = &member;
            return;
        }
    }

    if (existing->kind == SymbolKind::ExplicitImport && member.kind == SymbolKind::ExplicitImport) {
        if (!isElaborating) {
            // These can't be checked until we can resolve the imports and
            // see if they point to the same symbol.
            compilation.noteNameConflict(member);
        }
        else {
            checkImportConflict(member, *existing);
        }
        return;
    }

    if (existing->kind == SymbolKind::GenerateBlock && member.kind == SymbolKind::GenerateBlock) {
        // If both are generate blocks and both are from the same generate construct, it's ok
        // for them to have the same name. We take the one that is instantiated.
        auto& gen1 = existing->as<GenerateBlockSymbol>();
        auto& gen2 = member.as<GenerateBlockSymbol>();
        if (gen1.constructIndex == gen2.constructIndex) {
            SLANG_ASSERT(gen1.isUninstantiated || gen2.isUninstantiated);
            if (gen1.isUninstantiated)
                existing = &member;
            return;
        }
    }

    // A formal argument (port) and its associated variable declaration get merged into one.
    // This is a pretty gross "feature" but oh well.
    if ((existing->kind == SymbolKind::FormalArgument || existing->kind == SymbolKind::Variable) &&
        (member.kind == SymbolKind::FormalArgument || member.kind == SymbolKind::Variable) &&
        member.kind != existing->kind) {

        // The lookup index should be whichever symbol is earlier.
        uint32_t index = std::min(uint32_t(existing->getIndex()), uint32_t(member.getIndex()));

        if (existing->kind == SymbolKind::FormalArgument) {
            if (const_cast<FormalArgumentSymbol&>(existing->as<FormalArgumentSymbol>())
                    .mergeVariable(member.as<VariableSymbol>())) {
                const_cast<Symbol*>(existing)->setIndex(SymbolIndex(index));
                return;
            }
        }
        else {
            if (const_cast<FormalArgumentSymbol&>(member.as<FormalArgumentSymbol>())
                    .mergeVariable(existing->as<VariableSymbol>())) {
                const_cast<Symbol*>(existing)->setIndex(SymbolIndex(index));
                existing = &member;
                return;
            }
        }
    }

    if (!isElaborating && existing->isValue() && member.isValue()) {
        // We want to look at the symbol types here to provide nicer error messages, but
        // it might not be safe to resolve the type at this point (because we're in the
        // middle of elaborating the scope). Save the member for later reporting.
        compilation.noteNameConflict(member);
        return;
    }

    reportNameConflict(member, *existing);
}